

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_pit_name(parser *p)

{
  void *pvVar1;
  undefined8 *v;
  char *pcVar2;
  pit_profile *pit;
  pit_profile *h;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  v = (undefined8 *)mem_zalloc(0x78);
  *v = pvVar1;
  pcVar2 = parser_getstr(p,"name");
  pcVar2 = string_make(pcVar2);
  v[2] = pcVar2;
  v[0xd] = 0;
  v[0xe] = 0;
  parser_setpriv(p,v);
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_pit_name(struct parser *p) {
	struct pit_profile *h = parser_priv(p);
	struct pit_profile *pit = mem_zalloc(sizeof *pit);
	pit->next = h;
	pit->name = string_make(parser_getstr(p, "name"));
	pit->colors = NULL;
	pit->forbidden_monsters = NULL;
	parser_setpriv(p, pit);
	return PARSE_ERROR_NONE;
}